

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ignoreinvalidfree.h
# Opt level: O2

void __thiscall
Hoard::
IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
::free(IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
       *this,void *__ptr)

{
  ulong uVar1;
  size_t sVar2;
  
  if (((__ptr != (void *)0x0) && (uVar1 = (ulong)__ptr & 0xfffffffffffc0000, uVar1 != 0)) &&
     ((uVar1 ^ *(ulong *)(uVar1 + 8)) == 0xcafed00d)) {
    sVar2 = BaseHoardManager<Hoard::HoardSuperblock<HL::SpinLockType,_262144,_Hoard::SmallHeap,_Hoard::HoardSuperblockHeader>_>
            ::getSize(__ptr);
    if (0x8000 < sVar2) {
      HL::
      ThreadHeap<64,_HL::LockedHeap<HL::SpinLockType,_Hoard::ThresholdSegHeap<25,_1048576,_80,_&Hoard::GeometricSizeClass<>::size2class,_&Hoard::GeometricSizeClass<>::class2size,_2147483648UL,_HL::AdaptHeap<HL::DLList,_Hoard::objectSource>,_Hoard::objectSource>_>_>
      ::free(&(this->
              super_HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
              ).bm.super_bigHeapType,__ptr);
      return;
    }
    ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::free
              ((ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *)this,__ptr);
    return;
  }
  return;
}

Assistant:

INLINE void free (void * ptr) {
      if (ptr) {
	typename SuperHeap::SuperblockType * s = SuperHeap::getSuperblock (ptr);
	if (!s || (!s->isValidSuperblock())) {
	  // We encountered an invalid free, so we drop it.
	  return;
	}
	SuperHeap::free (ptr);
      }
    }